

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::insert(QByteArray *this,qsizetype i,QByteArrayView data)

{
  QByteArrayView data_00;
  bool bVar1;
  const_pointer pvVar2;
  QVarLengthArray<char,_256LL> *this_00;
  DataOps *pDVar3;
  char *pcVar4;
  storage_type *in_RDX;
  QVarLengthArray<char,_256LL> *in_RSI;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  qsizetype size;
  DataPointer detached;
  char *str;
  QVarLengthArray<char,_256LL> a;
  QVarLengthArray<char,_256LL> *in_stack_fffffffffffffe50;
  char **in_stack_fffffffffffffe58;
  QByteArrayView *in_stack_fffffffffffffe60;
  QVarLengthArray<char,_256LL> *c;
  QArrayDataPointer<char> *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe98;
  QArrayDataPointer<char> local_150;
  undefined1 local_120 [280];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = QByteArrayView::data((QByteArrayView *)&stack0xfffffffffffffed0);
  this_00 = (QVarLengthArray<char,_256LL> *)
            QByteArrayView::size((QByteArrayView *)&stack0xfffffffffffffed0);
  if ((-1 < (long)in_RSI) && (0 < (long)this_00)) {
    c = in_RSI;
    pDVar3 = QArrayDataPointer<char>::operator->(in_RDI);
    if ((long)in_RSI <
        (pDVar3->super_QCommonArrayOps<char>).super_Type.super_QArrayDataPointer<char>.size) {
      QArrayDataPointer<char>::operator->(in_RDI);
      bVar1 = QArrayDataPointer<char>::needsDetach
                        ((QArrayDataPointer<char> *)in_stack_fffffffffffffe50);
      if ((bVar1) ||
         (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<char>,char_const*>
                            ((char **)in_RSI,in_stack_fffffffffffffe68), !bVar1)) {
        QArrayDataPointer<char>::operator->(in_RDI);
        QtPrivate::QPodArrayOps<char>::insert
                  ((QPodArrayOps<char> *)in_RDI,(qsizetype)in_RSI,in_stack_fffffffffffffe98,
                   (qsizetype)in_stack_fffffffffffffe68);
        pcVar4 = QArrayDataPointer<char>::data(in_RDI);
        pcVar4[in_RDI->size] = '\0';
      }
      else {
        memset(local_120,0xaa,0x118);
        QVarLengthArray<char,_256LL>::QVarLengthArray<const_char_*,_true>
                  (this_00,(char *)in_RDI,(char *)in_RSI);
        QByteArrayView::QByteArrayView<QVarLengthArray<char,_256LL>,_true>
                  (in_stack_fffffffffffffe60,c);
        data_00.m_data = in_RDX;
        data_00.m_size = (qsizetype)pvVar2;
        in_RDI = &insert((QByteArray *)c,(qsizetype)this_00,data_00)->d;
        QVarLengthArray<char,_256LL>::~QVarLengthArray(in_stack_fffffffffffffe50);
      }
    }
    else {
      local_150.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_150.ptr = &DAT_aaaaaaaaaaaaaaaa;
      local_150.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<char>::QArrayDataPointer(&local_150);
      QArrayDataPointer<char>::detachAndGrow
                ((QArrayDataPointer<char> *)in_RSI,
                 (GrowthPosition)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                 (qsizetype)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (QArrayDataPointer<char> *)in_stack_fffffffffffffe50);
      qt_noop();
      QArrayDataPointer<char>::operator->(in_RDI);
      QArrayDataPointer<char>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<char>::copyAppend
                ((QPodArrayOps<char> *)c,(qsizetype)in_stack_fffffffffffffe58,
                 (parameter_type)((ulong)in_stack_fffffffffffffe50 >> 0x38));
      QArrayDataPointer<char>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<char>::copyAppend
                ((QPodArrayOps<char> *)c,(char *)in_stack_fffffffffffffe58,
                 (char *)in_stack_fffffffffffffe50);
      pcVar4 = QArrayDataPointer<char>::data(in_RDI);
      pcVar4[in_RDI->size] = '\0';
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)in_stack_fffffffffffffe50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)in_RDI;
}

Assistant:

QByteArray &QByteArray::insert(qsizetype i, QByteArrayView data)
{
    const char *str = data.data();
    qsizetype size = data.size();
    if (i < 0 || size <= 0)
        return *this;

    // handle this specially, as QArrayDataOps::insert() doesn't handle out of
    // bounds positions
    if (i >= d->size) {
        // In case when data points into the range or is == *this, we need to
        // defer a call to free() so that it comes after we copied the data from
        // the old memory:
        DataPointer detached{};  // construction is free
        d.detachAndGrow(Data::GrowsAtEnd, (i - d.size) + size, &str, &detached);
        Q_CHECK_PTR(d.data());
        d->copyAppend(i - d->size, ' ');
        d->copyAppend(str, str + size);
        d.data()[d.size] = '\0';
        return *this;
    }

    if (!d->needsDetach() && QtPrivate::q_points_into_range(str, d)) {
        QVarLengthArray a(str, str + size);
        return insert(i, a);
    }

    d->insert(i, str, size);
    d.data()[d.size] = '\0';
    return *this;
}